

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraInd.c
# Opt level: O1

Aig_Man_t * Fra_FramesWithClasses(Fra_Man_t *p)

{
  char *pcVar1;
  void *pvVar2;
  long lVar3;
  Aig_Man_t *p_00;
  size_t sVar4;
  char *pcVar5;
  Aig_Man_t *pAVar6;
  Aig_Obj_t *pAVar7;
  Vec_Ptr_t *pVVar8;
  int iVar9;
  long lVar10;
  uint uVar11;
  Aig_Obj_t *p1;
  uint uVar12;
  Aig_Obj_t *pAVar13;
  int iVar14;
  ulong uVar15;
  int iVar16;
  ulong uVar17;
  
  if (p->pManFraig != (Aig_Man_t *)0x0) {
    __assert_fail("p->pManFraig == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/fra/fraInd.c"
                  ,0x87,"Aig_Man_t *Fra_FramesWithClasses(Fra_Man_t *)");
  }
  pAVar6 = p->pManAig;
  if (pAVar6->nRegs < 1) {
    __assert_fail("Aig_ManRegNum(p->pManAig) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/fra/fraInd.c"
                  ,0x88,"Aig_Man_t *Fra_FramesWithClasses(Fra_Man_t *)");
  }
  if (pAVar6->nObjs[2] <= pAVar6->nRegs) {
    __assert_fail("Aig_ManRegNum(p->pManAig) < Aig_ManCiNum(p->pManAig)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/fra/fraInd.c"
                  ,0x89,"Aig_Man_t *Fra_FramesWithClasses(Fra_Man_t *)");
  }
  p_00 = Aig_ManStart(p->nFramesAll * pAVar6->vObjs->nSize);
  pAVar6 = p->pManAig;
  pcVar1 = pAVar6->pName;
  if (pcVar1 == (char *)0x0) {
    pcVar5 = (char *)0x0;
  }
  else {
    sVar4 = strlen(pcVar1);
    pcVar5 = (char *)malloc(sVar4 + 1);
    strcpy(pcVar5,pcVar1);
  }
  p_00->pName = pcVar5;
  pcVar1 = pAVar6->pSpec;
  if (pcVar1 == (char *)0x0) {
    pcVar5 = (char *)0x0;
  }
  else {
    sVar4 = strlen(pcVar1);
    pcVar5 = (char *)malloc(sVar4 + 1);
    strcpy(pcVar5,pcVar1);
  }
  p_00->pSpec = pcVar5;
  p_00->nRegs = pAVar6->nRegs;
  iVar16 = p->nFramesAll;
  if (0 < iVar16) {
    lVar10 = 0;
    do {
      pAVar7 = p->pManAig->pConst1;
      pvVar2 = (pAVar7->field_5).pData;
      *(Aig_Obj_t **)
       (*(long *)((long)pvVar2 + 0x20) +
       ((long)pAVar7->Id * (long)*(int *)((long)pvVar2 + 0x18) + lVar10) * 8) = p_00->pConst1;
      lVar10 = lVar10 + 1;
    } while (iVar16 != (int)lVar10);
  }
  if (0 < p->nFramesAll) {
    iVar16 = 0;
    do {
      pAVar6 = p->pManAig;
      if (pAVar6->nRegs < pAVar6->nObjs[2]) {
        lVar10 = 0;
        do {
          if (pAVar6->vCis->nSize <= lVar10) goto LAB_006954fe;
          pvVar2 = pAVar6->vCis->pArray[lVar10];
          pAVar7 = Aig_ObjCreateCi(p_00);
          lVar3 = *(long *)((long)pvVar2 + 0x28);
          *(Aig_Obj_t **)
           (*(long *)(lVar3 + 0x20) +
           (long)(*(int *)((long)pvVar2 + 0x24) * *(int *)(lVar3 + 0x18) + iVar16) * 8) = pAVar7;
          lVar10 = lVar10 + 1;
          pAVar6 = p->pManAig;
        } while (lVar10 < (long)pAVar6->nObjs[2] - (long)pAVar6->nRegs);
      }
      iVar16 = iVar16 + 1;
    } while (iVar16 < p->nFramesAll);
  }
  pAVar6 = p->pManAig;
  uVar12 = pAVar6->nObjs[2] - pAVar6->nRegs;
  pVVar8 = pAVar6->vCis;
  if ((int)uVar12 < pVVar8->nSize) {
    uVar17 = (ulong)uVar12;
    do {
      if ((int)uVar12 < 0) goto LAB_006954fe;
      pvVar2 = pVVar8->pArray[uVar17];
      pAVar7 = Aig_ObjCreateCi(p_00);
      lVar10 = *(long *)((long)pvVar2 + 0x28);
      *(Aig_Obj_t **)
       (*(long *)(lVar10 + 0x20) +
       (long)*(int *)((long)pvVar2 + 0x24) * (long)*(int *)(lVar10 + 0x18) * 8) = pAVar7;
      uVar17 = uVar17 + 1;
      pVVar8 = p->pManAig->vCis;
    } while ((int)uVar17 < pVVar8->nSize);
  }
  if (1 < p->nFramesAll) {
    iVar16 = 0;
    do {
      pAVar6 = p->pManAig;
      uVar12 = pAVar6->nObjs[2] - pAVar6->nRegs;
      pVVar8 = pAVar6->vCis;
      if ((int)uVar12 < pVVar8->nSize) {
        uVar17 = (ulong)uVar12;
        do {
          if ((int)uVar12 < 0) goto LAB_006954fe;
          Fra_FramesConstrainNode(p_00,(Aig_Obj_t *)pVVar8->pArray[uVar17],iVar16);
          uVar17 = uVar17 + 1;
          pVVar8 = p->pManAig->vCis;
        } while ((int)uVar17 < pVVar8->nSize);
      }
      pVVar8 = p->pManAig->vObjs;
      if (0 < pVVar8->nSize) {
        lVar10 = 0;
        do {
          pAVar7 = (Aig_Obj_t *)pVVar8->pArray[lVar10];
          if ((pAVar7 != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pAVar7->field_0x18 & 7) - 7))
          {
            if (((ulong)pAVar7 & 1) != 0) goto LAB_0069551d;
            uVar17 = (ulong)pAVar7->pFanin0 & 0xfffffffffffffffe;
            if (uVar17 == 0) {
              pAVar13 = (Aig_Obj_t *)0x0;
            }
            else {
              pAVar13 = (Aig_Obj_t *)
                        ((ulong)((uint)pAVar7->pFanin0 & 1) ^
                        *(ulong *)(*(long *)(*(long *)(uVar17 + 0x28) + 0x20) +
                                  (long)(*(int *)(uVar17 + 0x24) *
                                         *(int *)(*(long *)(uVar17 + 0x28) + 0x18) + iVar16) * 8));
            }
            uVar17 = (ulong)pAVar7->pFanin1 & 0xfffffffffffffffe;
            if (uVar17 == 0) {
              p1 = (Aig_Obj_t *)0x0;
            }
            else {
              p1 = (Aig_Obj_t *)
                   ((ulong)((uint)pAVar7->pFanin1 & 1) ^
                   *(ulong *)(*(long *)(*(long *)(uVar17 + 0x28) + 0x20) +
                             (long)(*(int *)(uVar17 + 0x24) *
                                    *(int *)(*(long *)(uVar17 + 0x28) + 0x18) + iVar16) * 8));
            }
            pAVar13 = Aig_And(p_00,pAVar13,p1);
            *(Aig_Obj_t **)
             (*(long *)((long)(pAVar7->field_5).pData + 0x20) +
             (long)(pAVar7->Id * *(int *)((long)(pAVar7->field_5).pData + 0x18) + iVar16) * 8) =
                 pAVar13;
            Fra_FramesConstrainNode(p_00,pAVar7,iVar16);
          }
          lVar10 = lVar10 + 1;
          pVVar8 = p->pManAig->vObjs;
        } while (lVar10 < pVVar8->nSize);
      }
      pAVar6 = p->pManAig;
      iVar14 = pAVar6->nRegs;
      if (0 < iVar14) {
        iVar9 = 0;
        do {
          uVar12 = (pAVar6->nObjs[3] - iVar14) + iVar9;
          if (((((int)uVar12 < 0) || (pAVar6->vCos->nSize <= (int)uVar12)) ||
              (uVar11 = (pAVar6->nObjs[2] - iVar14) + iVar9, (int)uVar11 < 0)) ||
             (pAVar6->vCis->nSize <= (int)uVar11)) goto LAB_006954fe;
          pvVar2 = pAVar6->vCos->pArray[uVar12];
          if (((ulong)pvVar2 & 1) != 0) {
LAB_0069551d:
            __assert_fail("!Aig_IsComplement(pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/fra/fra.h"
                          ,0x110,"Aig_Obj_t *Fra_ObjChild0Fra(Aig_Obj_t *, int)");
          }
          uVar17 = *(ulong *)((long)pvVar2 + 8);
          uVar15 = uVar17 & 0xfffffffffffffffe;
          if (uVar15 == 0) {
            uVar17 = 0;
          }
          else {
            uVar17 = (ulong)((uint)uVar17 & 1) ^
                     *(ulong *)(*(long *)(*(long *)(uVar15 + 0x28) + 0x20) +
                               (long)(*(int *)(uVar15 + 0x24) *
                                      *(int *)(*(long *)(uVar15 + 0x28) + 0x18) + iVar16) * 8);
          }
          pvVar2 = pAVar6->vCis->pArray[uVar11];
          lVar10 = *(long *)((long)pvVar2 + 0x28);
          *(ulong *)(*(long *)(lVar10 + 0x20) +
                    (long)(*(int *)((long)pvVar2 + 0x24) * *(int *)(lVar10 + 0x18) + iVar16 + 1) * 8
                    ) = uVar17;
          iVar9 = iVar9 + 1;
          pAVar6 = p->pManAig;
          iVar14 = pAVar6->nRegs;
        } while (iVar9 < iVar14);
      }
      iVar16 = iVar16 + 1;
    } while (iVar16 < p->nFramesAll + -1);
  }
  p_00->nAsserts = p_00->nObjs[3];
  pAVar6 = p->pManAig;
  uVar12 = pAVar6->nObjs[2] - pAVar6->nRegs;
  pVVar8 = pAVar6->vCis;
  if ((int)uVar12 < pVVar8->nSize) {
    uVar17 = (ulong)uVar12;
    do {
      if ((int)uVar12 < 0) {
LAB_006954fe:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      lVar10 = *(long *)((long)pVVar8->pArray[uVar17] + 0x28);
      Aig_ObjCreateCo(p_00,*(Aig_Obj_t **)
                            (*(long *)(lVar10 + 0x20) + -8 +
                            ((long)*(int *)((long)pVVar8->pArray[uVar17] + 0x24) *
                             (long)*(int *)(lVar10 + 0x18) + (long)p->nFramesAll) * 8));
      uVar17 = uVar17 + 1;
      pVVar8 = p->pManAig->vCis;
    } while ((int)uVar17 < pVVar8->nSize);
  }
  Aig_ManCleanup(p_00);
  if (p_00->pData == (void *)0x0) {
    return p_00;
  }
  __assert_fail("pManFraig->pData == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/fra/fraInd.c"
                ,0xb6,"Aig_Man_t *Fra_FramesWithClasses(Fra_Man_t *)");
}

Assistant:

Aig_Man_t * Fra_FramesWithClasses( Fra_Man_t * p )
{
    Aig_Man_t * pManFraig;
    Aig_Obj_t * pObj, * pObjLi, * pObjLo, * pObjNew;
    int i, k, f;
    assert( p->pManFraig == NULL );
    assert( Aig_ManRegNum(p->pManAig) > 0 );
    assert( Aig_ManRegNum(p->pManAig) < Aig_ManCiNum(p->pManAig) );

    // start the fraig package
    pManFraig = Aig_ManStart( Aig_ManObjNumMax(p->pManAig) * p->nFramesAll );
    pManFraig->pName = Abc_UtilStrsav( p->pManAig->pName );
    pManFraig->pSpec = Abc_UtilStrsav( p->pManAig->pSpec );
    pManFraig->nRegs = p->pManAig->nRegs;
    // create PI nodes for the frames
    for ( f = 0; f < p->nFramesAll; f++ )
        Fra_ObjSetFraig( Aig_ManConst1(p->pManAig), f, Aig_ManConst1(pManFraig) );
    for ( f = 0; f < p->nFramesAll; f++ )
        Aig_ManForEachPiSeq( p->pManAig, pObj, i )
            Fra_ObjSetFraig( pObj, f, Aig_ObjCreateCi(pManFraig) );
    // create latches for the first frame
    Aig_ManForEachLoSeq( p->pManAig, pObj, i )
        Fra_ObjSetFraig( pObj, 0, Aig_ObjCreateCi(pManFraig) );

    // add timeframes
//    pManFraig->fAddStrash = 1;
    for ( f = 0; f < p->nFramesAll - 1; f++ )
    {
        // set the constraints on the latch outputs
        Aig_ManForEachLoSeq( p->pManAig, pObj, i )
            Fra_FramesConstrainNode( pManFraig, pObj, f );
        // add internal nodes of this frame
        Aig_ManForEachNode( p->pManAig, pObj, i )
        {
            pObjNew = Aig_And( pManFraig, Fra_ObjChild0Fra(pObj,f), Fra_ObjChild1Fra(pObj,f) );
            Fra_ObjSetFraig( pObj, f, pObjNew );
            Fra_FramesConstrainNode( pManFraig, pObj, f );
        }
        // transfer latch input to the latch outputs 
        Aig_ManForEachLiLoSeq( p->pManAig, pObjLi, pObjLo, k )
            Fra_ObjSetFraig( pObjLo, f+1, Fra_ObjChild0Fra(pObjLi,f) );
    }
//    pManFraig->fAddStrash = 0;
    // mark the asserts
    pManFraig->nAsserts = Aig_ManCoNum(pManFraig);
    // add the POs for the latch outputs of the last frame
    Aig_ManForEachLoSeq( p->pManAig, pObj, i )
        Aig_ObjCreateCo( pManFraig, Fra_ObjFraig(pObj,p->nFramesAll-1) );

    // remove dangling nodes
    Aig_ManCleanup( pManFraig );
    // make sure the satisfying assignment is node assigned
    assert( pManFraig->pData == NULL );
    return pManFraig;
}